

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_14::NameResolver::VisitCommand(NameResolver *this,Command *command)

{
  ModuleCommand *pMVar1;
  ScriptModuleCommand *pSVar2;
  AssertModuleCommand<(wabt::CommandType)5> *pAVar3;
  AssertModuleCommand<(wabt::CommandType)6> *pAVar4;
  AssertModuleCommand<(wabt::CommandType)7> *pAVar5;
  pointer pSVar6;
  undefined1 local_f0 [8];
  NameResolver new_resolver;
  Errors errors;
  AssertModuleCommand<(wabt::CommandType)5> *assert_invalid_command;
  Command *command_local;
  NameResolver *this_local;
  
  switch(command->type) {
  case First:
    pMVar1 = cast<wabt::ModuleCommand,wabt::Command>(command);
    VisitModule(this,&pMVar1->module);
    break;
  case ScriptModule:
    pSVar2 = cast<wabt::ScriptModuleCommand,wabt::Command>(command);
    VisitModule(this,&pSVar2->module);
    break;
  case Action:
  case Register:
  case AssertReturn:
  case AssertTrap:
  case AssertExhaustion:
  case AssertException:
    break;
  case AssertMalformed:
    break;
  case AssertInvalid:
    pAVar3 = cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>(command);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&new_resolver.result_);
    NameResolver((NameResolver *)local_f0,this->script_,(Errors *)&new_resolver.result_);
    pSVar6 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                       (&pAVar3->module);
    VisitScriptModule((NameResolver *)local_f0,pSVar6);
    ~NameResolver((NameResolver *)local_f0);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&new_resolver.result_);
    break;
  case AssertUnlinkable:
    pAVar4 = cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>(command);
    pSVar6 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                       (&pAVar4->module);
    VisitScriptModule(this,pSVar6);
    break;
  case AssertUninstantiable:
    pAVar5 = cast<wabt::AssertModuleCommand<(wabt::CommandType)7>,wabt::Command>(command);
    pSVar6 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                       (&pAVar5->module);
    VisitScriptModule(this,pSVar6);
  }
  return;
}

Assistant:

void NameResolver::VisitCommand(Command* command) {
  switch (command->type) {
    case CommandType::Module:
      VisitModule(&cast<ModuleCommand>(command)->module);
      break;

    case CommandType::ScriptModule:
      VisitModule(&cast<ScriptModuleCommand>(command)->module);
      break;

    case CommandType::Action:
    case CommandType::AssertReturn:
    case CommandType::AssertTrap:
    case CommandType::AssertExhaustion:
    case CommandType::AssertException:
    case CommandType::Register:
      /* Don't resolve a module_var, since it doesn't really behave like other
       * vars. You can't reference a module by index. */
      break;

    case CommandType::AssertMalformed:
      /* Malformed modules should not be text; the whole point of this
       * assertion is to test for malformed binary modules. */
      break;

    case CommandType::AssertInvalid: {
      auto* assert_invalid_command = cast<AssertInvalidCommand>(command);
      /* The module may be invalid because the names cannot be resolved; we
       * don't want to print errors or fail if that's the case, but we still
       * should try to resolve names when possible. */
      Errors errors;
      NameResolver new_resolver(script_, &errors);
      new_resolver.VisitScriptModule(assert_invalid_command->module.get());
      break;
    }

    case CommandType::AssertUnlinkable:
      VisitScriptModule(cast<AssertUnlinkableCommand>(command)->module.get());
      break;

    case CommandType::AssertUninstantiable:
      VisitScriptModule(
          cast<AssertUninstantiableCommand>(command)->module.get());
      break;
  }
}